

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osqp.c
# Opt level: O0

c_int osqp_update_alpha(OSQPWorkspace *work,c_float alpha_new)

{
  long in_RDI;
  char *in_XMM0_Qa;
  c_int local_8;
  
  if (in_RDI == 0) {
    local_8 = _osqp_error(0,in_XMM0_Qa);
  }
  else if (((double)in_XMM0_Qa <= 0.0) || (2.0 <= (double)in_XMM0_Qa)) {
    printf("ERROR in %s: ","osqp_update_alpha");
    printf("alpha must be between 0 and 2");
    printf("\n");
    local_8 = 1;
  }
  else {
    *(char **)(*(long *)(in_RDI + 0xb8) + 0x60) = in_XMM0_Qa;
    local_8 = 0;
  }
  return local_8;
}

Assistant:

c_int osqp_update_alpha(OSQPWorkspace *work, c_float alpha_new) {

  // Check if workspace has been initialized
  if (!work) return osqp_error(OSQP_WORKSPACE_NOT_INIT_ERROR);

  // Check that alpha is between 0 and 2
  if ((alpha_new <= 0.) || (alpha_new >= 2.)) {
#ifdef PRINTING
    c_eprint("alpha must be between 0 and 2");
#endif /* ifdef PRINTING */
    return 1;
  }

  // Update alpha
  work->settings->alpha = alpha_new;

  return 0;
}